

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTransformUtil.h
# Opt level: O0

void btTransformUtil::calculateDiffAxisAngle
               (btTransform *transform0,btTransform *transform1,btVector3 *axis,btScalar *angle)

{
  btMatrix3x3 *this;
  btScalar *pbVar1;
  btScalar *_y;
  btScalar *_z;
  btScalar *in_RCX;
  btVector3 *in_RDX;
  btTransform *in_RSI;
  btTransform *in_RDI;
  btScalar bVar2;
  btScalar len;
  btQuaternion dorn;
  btMatrix3x3 dmat;
  btScalar *in_stack_ffffffffffffff18;
  btScalar local_c0;
  btScalar local_bc;
  btScalar local_b8;
  btVector3 local_b4;
  btScalar local_a4;
  btVector3 local_a0;
  btQuadWord local_90;
  btQuaternion *in_stack_ffffffffffffff88;
  btMatrix3x3 *in_stack_ffffffffffffff90;
  btMatrix3x3 *in_stack_ffffffffffffffb8;
  btMatrix3x3 *in_stack_ffffffffffffffc0;
  
  this = btTransform::getBasis(in_RSI);
  btTransform::getBasis(in_RDI);
  btMatrix3x3::inverse(in_stack_ffffffffffffff90);
  ::operator*(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  btQuaternion::btQuaternion((btQuaternion *)0x181d94);
  btMatrix3x3::getRotation(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  btQuaternion::normalize((btQuaternion *)this);
  bVar2 = btQuaternion::getAngle((btQuaternion *)this);
  *in_RCX = bVar2;
  pbVar1 = btQuadWord::x(&local_90);
  _y = btQuadWord::y(&local_90);
  _z = btQuadWord::z(&local_90);
  btVector3::btVector3(&local_a0,pbVar1,_y,_z);
  *(undefined8 *)in_RDX->m_floats = local_a0.m_floats._0_8_;
  *(undefined8 *)(in_RDX->m_floats + 2) = local_a0.m_floats._8_8_;
  pbVar1 = btVector3::operator_cast_to_float_(in_RDX);
  pbVar1[3] = 0.0;
  local_a4 = btVector3::length2((btVector3 *)0x181e40);
  if (1.4210855e-14 <= local_a4) {
    btSqrt(0.0);
    btVector3::operator/=(this->m_el,in_stack_ffffffffffffff18);
  }
  else {
    local_b8 = 1.0;
    local_bc = 0.0;
    local_c0 = 0.0;
    btVector3::btVector3(&local_b4,&local_b8,&local_bc,&local_c0);
    *(undefined8 *)in_RDX->m_floats = local_b4.m_floats._0_8_;
    *(undefined8 *)(in_RDX->m_floats + 2) = local_b4.m_floats._8_8_;
  }
  return;
}

Assistant:

static void calculateDiffAxisAngle(const btTransform& transform0,const btTransform& transform1,btVector3& axis,btScalar& angle)
	{
		btMatrix3x3 dmat = transform1.getBasis() * transform0.getBasis().inverse();
		btQuaternion dorn;
		dmat.getRotation(dorn);

		///floating point inaccuracy can lead to w component > 1..., which breaks 
		dorn.normalize();
		
		angle = dorn.getAngle();
		axis = btVector3(dorn.x(),dorn.y(),dorn.z());
		axis[3] = btScalar(0.);
		//check for axis length
		btScalar len = axis.length2();
		if (len < SIMD_EPSILON*SIMD_EPSILON)
			axis = btVector3(btScalar(1.),btScalar(0.),btScalar(0.));
		else
			axis /= btSqrt(len);
	}